

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  Geometry *pGVar23;
  RTCIntersectArguments *pRVar24;
  RTCRayQueryContext *pRVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 (*pauVar30) [16];
  undefined4 uVar31;
  int iVar32;
  undefined4 uVar33;
  AABBNodeMB4D *node1;
  ulong uVar34;
  ulong uVar35;
  RayHit *pRVar36;
  RayHit *pRVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined8 uVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar60 [16];
  float fVar64;
  float fVar65;
  float fVar70;
  float fVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar85;
  float fVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar91;
  float fVar100;
  float fVar101;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1251;
  undefined1 (*local_1250) [16];
  ulong local_1248;
  ulong local_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  RayQueryContext *local_1228;
  undefined1 local_121c [4];
  undefined1 local_1218 [16];
  float local_1208;
  float fStack_1204;
  undefined4 uStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [16];
  RTCFilterFunctionNArguments local_11e8;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  ulong local_1198;
  ulong local_1190;
  ulong local_1188;
  ulong local_1180;
  ulong local_1178;
  ulong local_1170;
  float local_1168;
  float local_1164;
  float local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  uint local_1150;
  uint local_114c;
  uint local_1148;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [12];
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 *local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8 [4];
  float local_1098 [4];
  float local_1088 [4];
  float local_1078 [4];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1250 = (undefined1 (*) [16])local_f68;
      fVar122 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1008 = 0.0;
      if (0.0 <= fVar122) {
        local_1008 = fVar122;
      }
      aVar19 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar122 = (ray->super_RayK<1>).tfar;
      fVar147 = 0.0;
      if (0.0 <= fVar122) {
        fVar147 = fVar122;
      }
      uVar47 = -(uint)(1e-18 <= ABS(aVar19.x));
      uVar48 = -(uint)(1e-18 <= ABS(aVar19.y));
      uVar52 = -(uint)(1e-18 <= ABS(aVar19.z));
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1058 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1028 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar73 = divps(_DAT_01feca10,(undefined1  [16])aVar19);
      local_1068 = (float)(~uVar47 & 0x5d5e0b6b | auVar73._0_4_ & uVar47);
      fVar122 = (float)(~uVar48 & 0x5d5e0b6b | auVar73._4_4_ & uVar48);
      local_1018 = (float)(~uVar52 & 0x5d5e0b6b | auVar73._8_4_ & uVar52);
      local_1128 = local_1068 * 0.99999964;
      local_1138 = fVar122 * 0.99999964;
      local_1038 = local_1018 * 0.99999964;
      local_1068 = local_1068 * 1.0000004;
      fVar122 = fVar122 * 1.0000004;
      local_1018 = local_1018 * 1.0000004;
      local_fe8._4_4_ = fVar122;
      local_fe8._0_4_ = fVar122;
      fStack_fe0 = fVar122;
      fStack_fdc = fVar122;
      local_1180 = (ulong)(local_1128 < 0.0) << 4;
      local_1188 = (ulong)(local_1138 < 0.0) << 4 | 0x20;
      local_1190 = (ulong)(local_1038 < 0.0) << 4 | 0x40;
      uVar39 = local_1188 ^ 0x10;
      uVar42 = local_1190 ^ 0x10;
      auVar73._4_4_ = fVar147;
      auVar73._0_4_ = fVar147;
      auVar73._8_4_ = fVar147;
      auVar73._12_4_ = fVar147;
      _local_ff8 = mm_lookupmask_ps._240_8_;
      _uStack_ff0 = mm_lookupmask_ps._248_8_;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1124 = local_1128;
      fStack_1120 = local_1128;
      fStack_111c = local_1128;
      fStack_1134 = local_1138;
      fStack_1130 = local_1138;
      fStack_112c = local_1138;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      local_1198 = local_1180 ^ 0x10;
      uVar35 = local_1180;
      uVar41 = local_1180 ^ 0x10;
      uVar44 = local_1190;
      uVar46 = local_1188;
      fVar122 = local_1008;
      fVar147 = local_1008;
      fVar135 = local_1008;
      fVar130 = local_1008;
      fVar65 = local_1048;
      fVar59 = local_1048;
      fVar61 = local_1048;
      fVar62 = local_1048;
      fVar63 = local_1058;
      fVar64 = local_1058;
      fVar70 = local_1058;
      fVar71 = local_1058;
      fVar72 = local_1068;
      fVar91 = local_1068;
      fVar79 = local_1068;
      fVar80 = local_1068;
      fVar85 = local_1128;
      fVar86 = local_1128;
      fVar87 = local_1128;
      fVar88 = local_1128;
      fVar89 = local_1138;
      fVar90 = local_1138;
      fVar100 = local_1138;
      fVar101 = local_1138;
      fVar102 = local_1018;
      fVar109 = local_1018;
      fVar114 = local_1018;
      fVar115 = local_1018;
      fVar117 = local_1028;
      fVar118 = local_1028;
      fVar119 = local_1028;
      fVar120 = local_1028;
      fVar121 = local_1038;
      fVar123 = local_1038;
      fVar124 = local_1038;
      fVar125 = local_1038;
      local_1248 = uVar42;
      local_1240 = uVar39;
      local_1228 = context;
      do {
        do {
          do {
            if (local_1250 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar30 = local_1250 + -1;
            local_1250 = local_1250 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar30 + 8));
          uVar43 = *(ulong *)*local_1250;
          do {
            if ((uVar43 & 8) == 0) {
              fVar126 = (ray->super_RayK<1>).dir.field_0.m128[3];
              uVar34 = uVar43 & 0xfffffffffffffff0;
              pfVar6 = (float *)(uVar34 + 0x80 + uVar35);
              pfVar1 = (float *)(uVar34 + 0x20 + uVar35);
              auVar92._0_4_ = ((*pfVar6 * fVar126 + *pfVar1) - fVar65) * fVar85;
              auVar92._4_4_ = ((pfVar6[1] * fVar126 + pfVar1[1]) - fVar59) * fVar86;
              auVar92._8_4_ = ((pfVar6[2] * fVar126 + pfVar1[2]) - fVar61) * fVar87;
              auVar92._12_4_ = ((pfVar6[3] * fVar126 + pfVar1[3]) - fVar62) * fVar88;
              auVar74._4_4_ = fVar147;
              auVar74._0_4_ = fVar122;
              auVar74._8_4_ = fVar135;
              auVar74._12_4_ = fVar130;
              pfVar6 = (float *)(uVar34 + 0x80 + uVar46);
              pfVar1 = (float *)(uVar34 + 0x20 + uVar46);
              auVar74 = maxps(auVar74,auVar92);
              auVar111._0_4_ = ((*pfVar6 * fVar126 + *pfVar1) - fVar63) * fVar89;
              auVar111._4_4_ = ((pfVar6[1] * fVar126 + pfVar1[1]) - fVar64) * fVar90;
              auVar111._8_4_ = ((pfVar6[2] * fVar126 + pfVar1[2]) - fVar70) * fVar100;
              auVar111._12_4_ = ((pfVar6[3] * fVar126 + pfVar1[3]) - fVar71) * fVar101;
              pfVar6 = (float *)(uVar34 + 0x80 + uVar44);
              pfVar1 = (float *)(uVar34 + 0x20 + uVar44);
              auVar97._0_4_ = ((*pfVar6 * fVar126 + *pfVar1) - fVar117) * fVar121;
              auVar97._4_4_ = ((pfVar6[1] * fVar126 + pfVar1[1]) - fVar118) * fVar123;
              auVar97._8_4_ = ((pfVar6[2] * fVar126 + pfVar1[2]) - fVar119) * fVar124;
              auVar97._12_4_ = ((pfVar6[3] * fVar126 + pfVar1[3]) - fVar120) * fVar125;
              auVar92 = maxps(auVar111,auVar97);
              _local_1118 = maxps(auVar74,auVar92);
              pfVar7 = (float *)(uVar34 + 0x80 + uVar41);
              pfVar1 = (float *)(uVar34 + 0x20 + uVar41);
              pfVar8 = (float *)(uVar34 + 0x80 + uVar39);
              pfVar6 = (float *)(uVar34 + 0x20 + uVar39);
              auVar93._0_4_ = ((*pfVar7 * fVar126 + *pfVar1) - fVar65) * fVar72;
              auVar93._4_4_ = ((pfVar7[1] * fVar126 + pfVar1[1]) - fVar59) * fVar91;
              auVar93._8_4_ = ((pfVar7[2] * fVar126 + pfVar1[2]) - fVar61) * fVar79;
              auVar93._12_4_ = ((pfVar7[3] * fVar126 + pfVar1[3]) - fVar62) * fVar80;
              auVar103._0_4_ = ((*pfVar8 * fVar126 + *pfVar6) - fVar63) * (float)local_fe8._0_4_;
              auVar103._4_4_ = ((pfVar8[1] * fVar126 + pfVar6[1]) - fVar64) * (float)local_fe8._4_4_
              ;
              auVar103._8_4_ = ((pfVar8[2] * fVar126 + pfVar6[2]) - fVar70) * fStack_fe0;
              auVar103._12_4_ = ((pfVar8[3] * fVar126 + pfVar6[3]) - fVar71) * fStack_fdc;
              pfVar6 = (float *)(uVar34 + 0x80 + uVar42);
              pfVar1 = (float *)(uVar34 + 0x20 + uVar42);
              auVar105._0_4_ = ((*pfVar6 * fVar126 + *pfVar1) - fVar117) * fVar102;
              auVar105._4_4_ = ((pfVar6[1] * fVar126 + pfVar1[1]) - fVar118) * fVar109;
              auVar105._8_4_ = ((pfVar6[2] * fVar126 + pfVar1[2]) - fVar119) * fVar114;
              auVar105._12_4_ = ((pfVar6[3] * fVar126 + pfVar1[3]) - fVar120) * fVar115;
              auVar92 = minps(auVar103,auVar105);
              auVar74 = minps(auVar73,auVar93);
              auVar74 = minps(auVar74,auVar92);
              if (((uint)uVar43 & 7) == 6) {
                bVar26 = (fVar126 < *(float *)(uVar34 + 0xf0) &&
                         *(float *)(uVar34 + 0xe0) <= fVar126) && local_1118._0_4_ <= auVar74._0_4_;
                bVar27 = (fVar126 < *(float *)(uVar34 + 0xf4) &&
                         *(float *)(uVar34 + 0xe4) <= fVar126) && local_1118._4_4_ <= auVar74._4_4_;
                bVar28 = (fVar126 < *(float *)(uVar34 + 0xf8) &&
                         *(float *)(uVar34 + 0xe8) <= fVar126) && local_1118._8_4_ <= auVar74._8_4_;
                bVar29 = (fVar126 < *(float *)(uVar34 + 0xfc) &&
                         *(float *)(uVar34 + 0xec) <= fVar126) &&
                         local_1118._12_4_ <= auVar74._12_4_;
              }
              else {
                bVar26 = local_1118._0_4_ <= auVar74._0_4_;
                bVar27 = local_1118._4_4_ <= auVar74._4_4_;
                bVar28 = local_1118._8_4_ <= auVar74._8_4_;
                bVar29 = local_1118._12_4_ <= auVar74._12_4_;
              }
              auVar66._0_4_ = (uint)bVar26 * -0x80000000;
              auVar66._4_4_ = (uint)bVar27 * -0x80000000;
              auVar66._8_4_ = (uint)bVar28 * -0x80000000;
              auVar66._12_4_ = (uint)bVar29 * -0x80000000;
              uVar31 = movmskps((int)uVar34,auVar66);
              local_1170 = CONCAT44((int)(uVar34 >> 0x20),uVar31);
            }
            if ((uVar43 & 8) == 0) {
              if (local_1170 == 0) {
                iVar32 = 4;
              }
              else {
                uVar34 = uVar43 & 0xfffffffffffffff0;
                lVar38 = 0;
                if (local_1170 != 0) {
                  for (; (local_1170 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                iVar32 = 0;
                uVar43 = *(ulong *)(uVar34 + lVar38 * 8);
                uVar40 = local_1170 - 1 & local_1170;
                if (uVar40 != 0) {
                  uVar47 = *(uint *)(local_1118 + lVar38 * 4);
                  lVar38 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                    }
                  }
                  uVar22 = *(ulong *)(uVar34 + lVar38 * 8);
                  uVar48 = *(uint *)(local_1118 + lVar38 * 4);
                  uVar40 = uVar40 - 1 & uVar40;
                  uVar39 = local_1240;
                  uVar42 = local_1248;
                  if (uVar40 == 0) {
                    if (uVar47 < uVar48) {
                      *(ulong *)*local_1250 = uVar22;
                      *(uint *)((long)*local_1250 + 8) = uVar48;
                      local_1250 = local_1250 + 1;
                    }
                    else {
                      *(ulong *)*local_1250 = uVar43;
                      *(uint *)((long)*local_1250 + 8) = uVar47;
                      uVar43 = uVar22;
                      local_1250 = local_1250 + 1;
                    }
                  }
                  else {
                    auVar67._8_4_ = uVar47;
                    auVar67._0_8_ = uVar43;
                    auVar67._12_4_ = 0;
                    auVar75._8_4_ = uVar48;
                    auVar75._0_8_ = uVar22;
                    auVar75._12_4_ = 0;
                    lVar38 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    uVar43 = *(ulong *)(uVar34 + lVar38 * 8);
                    iVar20 = *(int *)(local_1118 + lVar38 * 4);
                    auVar81._8_4_ = iVar20;
                    auVar81._0_8_ = uVar43;
                    auVar81._12_4_ = 0;
                    auVar94._8_4_ = -(uint)((int)uVar47 < (int)uVar48);
                    uVar40 = uVar40 - 1 & uVar40;
                    if (uVar40 == 0) {
                      auVar94._4_4_ = auVar94._8_4_;
                      auVar94._0_4_ = auVar94._8_4_;
                      auVar94._12_4_ = auVar94._8_4_;
                      auVar74 = auVar67 & auVar94 | ~auVar94 & auVar75;
                      auVar92 = auVar75 & auVar94 | ~auVar94 & auVar67;
                      auVar95._8_4_ = -(uint)(auVar74._8_4_ < iVar20);
                      auVar95._0_8_ = CONCAT44(auVar95._8_4_,auVar95._8_4_);
                      auVar95._12_4_ = auVar95._8_4_;
                      uVar43 = ~auVar95._0_8_ & uVar43 | auVar74._0_8_ & auVar95._0_8_;
                      auVar74 = auVar81 & auVar95 | ~auVar95 & auVar74;
                      auVar68._8_4_ = -(uint)(auVar92._8_4_ < auVar74._8_4_);
                      auVar68._4_4_ = auVar68._8_4_;
                      auVar68._0_4_ = auVar68._8_4_;
                      auVar68._12_4_ = auVar68._8_4_;
                      *local_1250 = ~auVar68 & auVar92 | auVar74 & auVar68;
                      local_1250[1] = auVar92 & auVar68 | ~auVar68 & auVar74;
                      local_1250 = local_1250 + 2;
                    }
                    else {
                      lVar38 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                        }
                      }
                      iVar21 = *(int *)(local_1118 + lVar38 * 4);
                      auVar104._8_4_ = iVar21;
                      auVar104._0_8_ = *(undefined8 *)(uVar34 + lVar38 * 8);
                      auVar104._12_4_ = 0;
                      auVar96._4_4_ = auVar94._8_4_;
                      auVar96._0_4_ = auVar94._8_4_;
                      auVar96._8_4_ = auVar94._8_4_;
                      auVar96._12_4_ = auVar94._8_4_;
                      auVar74 = auVar67 & auVar96 | ~auVar96 & auVar75;
                      auVar92 = auVar75 & auVar96 | ~auVar96 & auVar67;
                      auVar110._0_4_ = -(uint)(iVar20 < iVar21);
                      auVar110._4_4_ = -(uint)(iVar20 < iVar21);
                      auVar110._8_4_ = -(uint)(iVar20 < iVar21);
                      auVar110._12_4_ = -(uint)(iVar20 < iVar21);
                      auVar97 = auVar81 & auVar110 | ~auVar110 & auVar104;
                      auVar111 = ~auVar110 & auVar81 | auVar104 & auVar110;
                      auVar82._8_4_ = -(uint)(auVar92._8_4_ < auVar111._8_4_);
                      auVar82._4_4_ = auVar82._8_4_;
                      auVar82._0_4_ = auVar82._8_4_;
                      auVar82._12_4_ = auVar82._8_4_;
                      auVar105 = auVar92 & auVar82 | ~auVar82 & auVar111;
                      auVar76._8_4_ = -(uint)(auVar74._8_4_ < auVar97._8_4_);
                      auVar76._0_8_ = CONCAT44(auVar76._8_4_,auVar76._8_4_);
                      auVar76._12_4_ = auVar76._8_4_;
                      uVar43 = auVar74._0_8_ & auVar76._0_8_ | ~auVar76._0_8_ & auVar97._0_8_;
                      auVar74 = ~auVar76 & auVar74 | auVar97 & auVar76;
                      auVar69._8_4_ = -(uint)(auVar74._8_4_ < auVar105._8_4_);
                      auVar69._4_4_ = auVar69._8_4_;
                      auVar69._0_4_ = auVar69._8_4_;
                      auVar69._12_4_ = auVar69._8_4_;
                      *local_1250 = ~auVar82 & auVar92 | auVar111 & auVar82;
                      local_1250[1] = ~auVar69 & auVar74 | auVar105 & auVar69;
                      local_1250[2] = auVar74 & auVar69 | ~auVar69 & auVar105;
                      local_1250 = local_1250 + 3;
                      fVar85 = local_1128;
                      fVar86 = fStack_1124;
                      fVar87 = fStack_1120;
                      fVar88 = fStack_111c;
                      fVar89 = local_1138;
                      fVar90 = fStack_1134;
                      fVar100 = fStack_1130;
                      fVar101 = fStack_112c;
                    }
                  }
                }
              }
            }
            else {
              iVar32 = 6;
            }
          } while (iVar32 == 0);
        } while (iVar32 != 6);
        uVar35 = (ulong)((uint)uVar43 & 0xf) - 8;
        local_1178 = uVar35;
        if (uVar35 != 0) {
          uVar43 = uVar43 & 0xfffffffffffffff0;
          uVar41 = 0;
          do {
            lVar38 = uVar41 * 0x140;
            fVar122 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar9 = (float *)(uVar43 + 0x90 + lVar38);
            pfVar1 = (float *)(uVar43 + lVar38);
            pfVar10 = (float *)(uVar43 + 0xa0 + lVar38);
            pfVar6 = (float *)(uVar43 + 0x10 + lVar38);
            pfVar11 = (float *)(uVar43 + 0xb0 + lVar38);
            pfVar7 = (float *)(uVar43 + 0x20 + lVar38);
            pfVar12 = (float *)(uVar43 + 0xc0 + lVar38);
            pfVar8 = (float *)(uVar43 + 0x30 + lVar38);
            pfVar13 = (float *)(uVar43 + 0xd0 + lVar38);
            pfVar2 = (float *)(uVar43 + 0x40 + lVar38);
            pfVar14 = (float *)(uVar43 + 0xe0 + lVar38);
            pfVar3 = (float *)(uVar43 + 0x50 + lVar38);
            pfVar15 = (float *)(uVar43 + 0xf0 + lVar38);
            pfVar4 = (float *)(uVar43 + 0x60 + lVar38);
            pfVar16 = (float *)(uVar43 + 0x100 + lVar38);
            pfVar5 = (float *)(uVar43 + 0x70 + lVar38);
            pfVar17 = (float *)(uVar43 + 0x110 + lVar38);
            pfVar18 = (float *)(uVar43 + 0x80 + lVar38);
            fVar147 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar135 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar130 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_f98 = (*pfVar9 * fVar122 + *pfVar1) - fVar147;
            fStack_f94 = (pfVar9[1] * fVar122 + pfVar1[1]) - fVar147;
            fStack_f90 = (pfVar9[2] * fVar122 + pfVar1[2]) - fVar147;
            fStack_f8c = (pfVar9[3] * fVar122 + pfVar1[3]) - fVar147;
            fVar120 = (*pfVar10 * fVar122 + *pfVar6) - fVar135;
            fVar123 = (pfVar10[1] * fVar122 + pfVar6[1]) - fVar135;
            fStack_11a0 = (pfVar10[2] * fVar122 + pfVar6[2]) - fVar135;
            fStack_119c = (pfVar10[3] * fVar122 + pfVar6[3]) - fVar135;
            local_f88 = (*pfVar11 * fVar122 + *pfVar7) - fVar130;
            fStack_f84 = (pfVar11[1] * fVar122 + pfVar7[1]) - fVar130;
            fStack_f80 = (pfVar11[2] * fVar122 + pfVar7[2]) - fVar130;
            fStack_f7c = (pfVar11[3] * fVar122 + pfVar7[3]) - fVar130;
            fVar91 = (*pfVar12 * fVar122 + *pfVar8) - fVar147;
            fVar100 = (pfVar12[1] * fVar122 + pfVar8[1]) - fVar147;
            fVar101 = (pfVar12[2] * fVar122 + pfVar8[2]) - fVar147;
            fVar102 = (pfVar12[3] * fVar122 + pfVar8[3]) - fVar147;
            fVar136 = (*pfVar13 * fVar122 + *pfVar2) - fVar135;
            fVar138 = (pfVar13[1] * fVar122 + pfVar2[1]) - fVar135;
            fVar140 = (pfVar13[2] * fVar122 + pfVar2[2]) - fVar135;
            fVar142 = (pfVar13[3] * fVar122 + pfVar2[3]) - fVar135;
            fVar115 = (*pfVar14 * fVar122 + *pfVar3) - fVar130;
            fVar117 = (pfVar14[1] * fVar122 + pfVar3[1]) - fVar130;
            fVar118 = (pfVar14[2] * fVar122 + pfVar3[2]) - fVar130;
            fVar119 = (pfVar14[3] * fVar122 + pfVar3[3]) - fVar130;
            fVar144 = (*pfVar15 * fVar122 + *pfVar4) - fVar147;
            fVar145 = (pfVar15[1] * fVar122 + pfVar4[1]) - fVar147;
            fVar146 = (pfVar15[2] * fVar122 + pfVar4[2]) - fVar147;
            fVar147 = (pfVar15[3] * fVar122 + pfVar4[3]) - fVar147;
            fVar131 = (*pfVar16 * fVar122 + *pfVar5) - fVar135;
            fVar133 = (pfVar16[1] * fVar122 + pfVar5[1]) - fVar135;
            fVar134 = (pfVar16[2] * fVar122 + pfVar5[2]) - fVar135;
            fVar135 = (pfVar16[3] * fVar122 + pfVar5[3]) - fVar135;
            fVar127 = (fVar122 * *pfVar17 + *pfVar18) - fVar130;
            fVar128 = (fVar122 * pfVar17[1] + pfVar18[1]) - fVar130;
            fVar129 = (fVar122 * pfVar17[2] + pfVar18[2]) - fVar130;
            fVar130 = (fVar122 * pfVar17[3] + pfVar18[3]) - fVar130;
            fVar79 = fVar144 - local_f98;
            fVar85 = fVar145 - fStack_f94;
            fVar87 = fVar146 - fStack_f90;
            fVar89 = fVar147 - fStack_f8c;
            local_fb8 = fVar131 - fVar120;
            fStack_fb4 = fVar133 - fVar123;
            fStack_fb0 = fVar134 - fStack_11a0;
            fStack_fac = fVar135 - fStack_119c;
            local_fa8 = fVar127 - local_f88;
            fStack_fa4 = fVar128 - fStack_f84;
            fStack_fa0 = fVar129 - fStack_f80;
            fStack_f9c = fVar130 - fStack_f7c;
            local_11b8 = fVar79;
            fStack_11b4 = fVar85;
            fStack_11b0 = fVar87;
            fStack_11ac = fVar89;
            fVar122 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar65 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1204 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar109 = (local_fb8 * (fVar127 + local_f88) - local_fa8 * (fVar131 + fVar120)) *
                      fVar122 + (local_fa8 * (fVar144 + local_f98) - (fVar127 + local_f88) * fVar79)
                                * fVar65 +
                                ((fVar131 + fVar120) * fVar79 - (fVar144 + local_f98) * local_fb8) *
                                fStack_1204;
            fVar114 = (fStack_fb4 * (fVar128 + fStack_f84) - fStack_fa4 * (fVar133 + fVar123)) *
                      fVar122 + (fStack_fa4 * (fVar145 + fStack_f94) -
                                (fVar128 + fStack_f84) * fVar85) * fVar65 +
                                ((fVar133 + fVar123) * fVar85 - (fVar145 + fStack_f94) * fStack_fb4)
                                * fStack_1204;
            local_fc8._0_8_ = CONCAT44(fVar114,fVar109);
            local_fc8._8_4_ =
                 (fStack_fb0 * (fVar129 + fStack_f80) - fStack_fa0 * (fVar134 + fStack_11a0)) *
                 fVar122 + (fStack_fa0 * (fVar146 + fStack_f90) - (fVar129 + fStack_f80) * fVar87) *
                           fVar65 + ((fVar134 + fStack_11a0) * fVar87 -
                                    (fVar146 + fStack_f90) * fStack_fb0) * fStack_1204;
            local_fc8._12_4_ =
                 (fStack_fac * (fVar130 + fStack_f7c) - fStack_f9c * (fVar135 + fStack_119c)) *
                 fVar122 + (fStack_f9c * (fVar147 + fStack_f8c) - (fVar130 + fStack_f7c) * fVar89) *
                           fVar65 + ((fVar135 + fStack_119c) * fVar89 -
                                    (fVar147 + fStack_f8c) * fStack_fac) * fStack_1204;
            fVar80 = fVar120 - fVar136;
            fVar86 = fVar123 - fVar138;
            fVar88 = fStack_11a0 - fVar140;
            fVar90 = fStack_119c - fVar142;
            fVar137 = local_f88 - fVar115;
            fVar139 = fStack_f84 - fVar117;
            fVar141 = fStack_f80 - fVar118;
            fVar143 = fStack_f7c - fVar119;
            local_11a8 = CONCAT44(fVar123,fVar120);
            fVar59 = local_f98 - fVar91;
            fVar61 = fStack_f94 - fVar100;
            fVar62 = fStack_f90 - fVar101;
            fVar63 = fStack_f8c - fVar102;
            local_1218._0_4_ =
                 (fVar80 * (local_f88 + fVar115) - fVar137 * (fVar120 + fVar136)) * fVar122 +
                 (fVar137 * (local_f98 + fVar91) - (local_f88 + fVar115) * fVar59) * fVar65 +
                 ((fVar120 + fVar136) * fVar59 - (local_f98 + fVar91) * fVar80) * fStack_1204;
            local_1218._4_4_ =
                 (fVar86 * (fStack_f84 + fVar117) - fVar139 * (fVar123 + fVar138)) * fVar122 +
                 (fVar139 * (fStack_f94 + fVar100) - (fStack_f84 + fVar117) * fVar61) * fVar65 +
                 ((fVar123 + fVar138) * fVar61 - (fStack_f94 + fVar100) * fVar86) * fStack_1204;
            local_1218._8_4_ =
                 (fVar88 * (fStack_f80 + fVar118) - fVar141 * (fStack_11a0 + fVar140)) * fVar122 +
                 (fVar141 * (fStack_f90 + fVar101) - (fStack_f80 + fVar118) * fVar62) * fVar65 +
                 ((fStack_11a0 + fVar140) * fVar62 - (fStack_f90 + fVar101) * fVar88) * fStack_1204;
            local_1218._12_4_ =
                 (fVar90 * (fStack_f7c + fVar119) - fVar143 * (fStack_119c + fVar142)) * fVar122 +
                 (fVar143 * (fStack_f8c + fVar102) - (fStack_f7c + fVar119) * fVar63) * fVar65 +
                 ((fStack_119c + fVar142) * fVar63 - (fStack_f8c + fVar102) * fVar90) * fStack_1204;
            fVar64 = fVar91 - fVar144;
            fVar70 = fVar100 - fVar145;
            fVar71 = fVar101 - fVar146;
            fVar72 = fVar102 - fVar147;
            local_fd8 = fVar136 - fVar131;
            fStack_fd4 = fVar138 - fVar133;
            fStack_fd0 = fVar140 - fVar134;
            fStack_fcc = fVar142 - fVar135;
            fVar121 = fVar115 - fVar127;
            fVar124 = fVar117 - fVar128;
            fVar125 = fVar118 - fVar129;
            fVar126 = fVar119 - fVar130;
            local_1208 = fStack_1204;
            uStack_1200 = fStack_1204;
            fStack_11fc = fStack_1204;
            auVar77._0_4_ =
                 (local_fd8 * (fVar127 + fVar115) - fVar121 * (fVar131 + fVar136)) * fVar122 +
                 (fVar121 * (fVar144 + fVar91) - (fVar127 + fVar115) * fVar64) * fVar65 +
                 ((fVar131 + fVar136) * fVar64 - (fVar144 + fVar91) * local_fd8) * fStack_1204;
            auVar77._4_4_ =
                 (fStack_fd4 * (fVar128 + fVar117) - fVar124 * (fVar133 + fVar138)) * fVar122 +
                 (fVar124 * (fVar145 + fVar100) - (fVar128 + fVar117) * fVar70) * fVar65 +
                 ((fVar133 + fVar138) * fVar70 - (fVar145 + fVar100) * fStack_fd4) * fStack_1204;
            auVar77._8_4_ =
                 (fStack_fd0 * (fVar129 + fVar118) - fVar125 * (fVar134 + fVar140)) * fVar122 +
                 (fVar125 * (fVar146 + fVar101) - (fVar129 + fVar118) * fVar71) * fVar65 +
                 ((fVar134 + fVar140) * fVar71 - (fVar146 + fVar101) * fStack_fd0) * fStack_1204;
            auVar77._12_4_ =
                 (fStack_fcc * (fVar130 + fVar119) - fVar126 * (fVar135 + fVar142)) * fVar122 +
                 (fVar126 * (fVar147 + fVar102) - (fVar130 + fVar119) * fVar72) * fVar65 +
                 ((fVar135 + fVar142) * fVar72 - (fVar147 + fVar102) * fStack_fcc) * fStack_1204;
            local_11b8 = fVar109 + (float)local_1218._0_4_ + auVar77._0_4_;
            fStack_11b4 = fVar114 + local_1218._4_4_ + auVar77._4_4_;
            fStack_11b0 = local_fc8._8_4_ + local_1218._8_4_ + auVar77._8_4_;
            fStack_11ac = local_fc8._12_4_ + local_1218._12_4_ + auVar77._12_4_;
            auVar116._8_4_ = local_fc8._8_4_;
            auVar116._0_8_ = local_fc8._0_8_;
            auVar116._12_4_ = local_fc8._12_4_;
            auVar73 = minps(auVar116,local_1218);
            auVar74 = minps(auVar73,auVar77);
            auVar73 = maxps(local_fc8,local_1218);
            auVar73 = maxps(auVar73,auVar77);
            fVar147 = ABS(local_11b8) * 1.1920929e-07;
            fVar135 = ABS(fStack_11b4) * 1.1920929e-07;
            fVar130 = ABS(fStack_11b0) * 1.1920929e-07;
            fVar91 = ABS(fStack_11ac) * 1.1920929e-07;
            local_10e8 = &local_1251;
            auVar112._0_4_ =
                 -(uint)(auVar73._0_4_ <= fVar147 || -fVar147 <= auVar74._0_4_) & local_ff8;
            auVar112._4_4_ =
                 -(uint)(auVar73._4_4_ <= fVar135 || -fVar135 <= auVar74._4_4_) & uStack_ff4;
            auVar112._8_4_ =
                 -(uint)(auVar73._8_4_ <= fVar130 || -fVar130 <= auVar74._8_4_) & uStack_ff0;
            auVar112._12_4_ =
                 -(uint)(auVar73._12_4_ <= fVar91 || -fVar91 <= auVar74._12_4_) & uStack_fec;
            uVar31 = (undefined4)(uVar35 >> 0x20);
            iVar32 = movmskps((int)uVar35,auVar112);
            uVar35 = CONCAT44(uVar31,iVar32);
            if (iVar32 != 0) {
              uVar47 = -(uint)(ABS(fVar137 * local_fd8) <= ABS(local_fa8 * fVar80));
              uVar49 = -(uint)(ABS(fVar139 * fStack_fd4) <= ABS(fStack_fa4 * fVar86));
              uVar53 = -(uint)(ABS(fVar141 * fStack_fd0) <= ABS(fStack_fa0 * fVar88));
              uVar56 = -(uint)(ABS(fVar143 * fStack_fcc) <= ABS(fStack_f9c * fVar90));
              uVar48 = -(uint)(ABS(fVar59 * fVar121) <= ABS(fVar79 * fVar137));
              uVar50 = -(uint)(ABS(fVar61 * fVar124) <= ABS(fVar85 * fVar139));
              uVar54 = -(uint)(ABS(fVar62 * fVar125) <= ABS(fVar87 * fVar141));
              uVar57 = -(uint)(ABS(fVar63 * fVar126) <= ABS(fVar89 * fVar143));
              uVar52 = -(uint)(ABS(fVar80 * fVar64) <= ABS(local_fb8 * fVar59));
              uVar51 = -(uint)(ABS(fVar86 * fVar70) <= ABS(fStack_fb4 * fVar61));
              uVar55 = -(uint)(ABS(fVar88 * fVar71) <= ABS(fStack_fb0 * fVar62));
              uVar58 = -(uint)(ABS(fVar90 * fVar72) <= ABS(fStack_fac * fVar63));
              local_10f8._4_4_ = fStack_11b4;
              local_10f8._0_4_ = local_11b8;
              local_10f8._8_4_ = fStack_11b0;
              local_10f8._12_4_ = fStack_11ac;
              local_1098[0] =
                   (float)(~uVar47 & (uint)(local_fb8 * fVar137 - local_fa8 * fVar80) |
                          (uint)(fVar80 * fVar121 - fVar137 * local_fd8) & uVar47);
              local_1098[1] =
                   (float)(~uVar49 & (uint)(fStack_fb4 * fVar139 - fStack_fa4 * fVar86) |
                          (uint)(fVar86 * fVar124 - fVar139 * fStack_fd4) & uVar49);
              local_1098[2] =
                   (float)(~uVar53 & (uint)(fStack_fb0 * fVar141 - fStack_fa0 * fVar88) |
                          (uint)(fVar88 * fVar125 - fVar141 * fStack_fd0) & uVar53);
              local_1098[3] =
                   (float)(~uVar56 & (uint)(fStack_fac * fVar143 - fStack_f9c * fVar90) |
                          (uint)(fVar90 * fVar126 - fVar143 * fStack_fcc) & uVar56);
              local_1088[0] =
                   (float)(~uVar48 & (uint)(local_fa8 * fVar59 - fVar79 * fVar137) |
                          (uint)(fVar137 * fVar64 - fVar59 * fVar121) & uVar48);
              local_1088[1] =
                   (float)(~uVar50 & (uint)(fStack_fa4 * fVar61 - fVar85 * fVar139) |
                          (uint)(fVar139 * fVar70 - fVar61 * fVar124) & uVar50);
              local_1088[2] =
                   (float)(~uVar54 & (uint)(fStack_fa0 * fVar62 - fVar87 * fVar141) |
                          (uint)(fVar141 * fVar71 - fVar62 * fVar125) & uVar54);
              local_1088[3] =
                   (float)(~uVar57 & (uint)(fStack_f9c * fVar63 - fVar89 * fVar143) |
                          (uint)(fVar143 * fVar72 - fVar63 * fVar126) & uVar57);
              local_1078[0] =
                   (float)(~uVar52 & (uint)(fVar79 * fVar80 - local_fb8 * fVar59) |
                          (uint)(fVar59 * local_fd8 - fVar80 * fVar64) & uVar52);
              local_1078[1] =
                   (float)(~uVar51 & (uint)(fVar85 * fVar86 - fStack_fb4 * fVar61) |
                          (uint)(fVar61 * fStack_fd4 - fVar86 * fVar70) & uVar51);
              local_1078[2] =
                   (float)(~uVar55 & (uint)(fVar87 * fVar88 - fStack_fb0 * fVar62) |
                          (uint)(fVar62 * fStack_fd0 - fVar88 * fVar71) & uVar55);
              local_1078[3] =
                   (float)(~uVar58 & (uint)(fVar89 * fVar90 - fStack_fac * fVar63) |
                          (uint)(fVar63 * fStack_fcc - fVar90 * fVar72) & uVar58);
              fVar147 = fVar122 * local_1098[0] +
                        fVar65 * local_1088[0] + fStack_1204 * local_1078[0];
              fVar135 = fVar122 * local_1098[1] +
                        fVar65 * local_1088[1] + fStack_1204 * local_1078[1];
              fVar130 = fVar122 * local_1098[2] +
                        fVar65 * local_1088[2] + fStack_1204 * local_1078[2];
              fVar122 = fVar122 * local_1098[3] +
                        fVar65 * local_1088[3] + fStack_1204 * local_1078[3];
              auVar106._0_4_ = fVar147 + fVar147;
              auVar106._4_4_ = fVar135 + fVar135;
              auVar106._8_4_ = fVar130 + fVar130;
              auVar106._12_4_ = fVar122 + fVar122;
              auVar60._0_4_ = fVar120 * local_1088[0] + local_f88 * local_1078[0];
              auVar60._4_4_ = fVar123 * local_1088[1] + fStack_f84 * local_1078[1];
              auVar60._8_4_ = fStack_11a0 * local_1088[2] + fStack_f80 * local_1078[2];
              auVar60._12_4_ = fStack_119c * local_1088[3] + fStack_f7c * local_1078[3];
              fVar65 = local_f98 * local_1098[0] + auVar60._0_4_;
              fVar59 = fStack_f94 * local_1098[1] + auVar60._4_4_;
              fVar61 = fStack_f90 * local_1098[2] + auVar60._8_4_;
              fVar62 = fStack_f8c * local_1098[3] + auVar60._12_4_;
              auVar73 = rcpps(auVar60,auVar106);
              fVar122 = auVar73._0_4_;
              fVar147 = auVar73._4_4_;
              fVar135 = auVar73._8_4_;
              fVar130 = auVar73._12_4_;
              local_1238 = ((1.0 - auVar106._0_4_ * fVar122) * fVar122 + fVar122) *
                           (fVar65 + fVar65);
              fStack_1234 = ((1.0 - auVar106._4_4_ * fVar147) * fVar147 + fVar147) *
                            (fVar59 + fVar59);
              fStack_1230 = ((1.0 - auVar106._8_4_ * fVar135) * fVar135 + fVar135) *
                            (fVar61 + fVar61);
              fStack_122c = ((1.0 - auVar106._12_4_ * fVar130) * fVar130 + fVar130) *
                            (fVar62 + fVar62);
              fVar122 = (ray->super_RayK<1>).tfar;
              fVar147 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar107._0_4_ =
                   (int)((uint)(auVar106._0_4_ != 0.0 &&
                               (local_1238 <= fVar122 && fVar147 <= local_1238)) * -0x80000000) >>
                   0x1f;
              auVar107._4_4_ =
                   (int)((uint)(auVar106._4_4_ != 0.0 &&
                               (fStack_1234 <= fVar122 && fVar147 <= fStack_1234)) * -0x80000000) >>
                   0x1f;
              auVar107._8_4_ =
                   (int)((uint)(auVar106._8_4_ != 0.0 &&
                               (fStack_1230 <= fVar122 && fVar147 <= fStack_1230)) * -0x80000000) >>
                   0x1f;
              auVar107._12_4_ =
                   (int)((uint)(auVar106._12_4_ != 0.0 &&
                               (fStack_122c <= fVar122 && fVar147 <= fStack_122c)) * -0x80000000) >>
                   0x1f;
              auVar108 = auVar107 & auVar112;
              iVar32 = movmskps(iVar32,auVar108);
              uVar35 = CONCAT44(uVar31,iVar32);
              if (iVar32 != 0) {
                local_1118._8_4_ = local_fc8._8_4_;
                local_1118._0_8_ = local_fc8._0_8_;
                fStack_110c = local_fc8._12_4_;
                local_1108 = (float)local_1218._0_4_;
                fStack_1104 = local_1218._4_4_;
                fStack_1100 = local_1218._8_4_;
                fStack_10fc = local_1218._12_4_;
                local_10d8 = auVar108;
                local_10a8[0] = local_1238;
                local_10a8[1] = fStack_1234;
                local_10a8[2] = fStack_1230;
                local_10a8[3] = fStack_122c;
                uVar45 = context->scene;
                uVar47 = auVar108._0_4_;
                uVar48 = auVar108._4_4_;
                uVar52 = auVar108._8_4_;
                uVar49 = auVar108._12_4_;
                local_11f8 = auVar108;
                auVar73 = rcpps(auVar108,local_10f8);
                fVar122 = auVar73._0_4_;
                fVar147 = auVar73._4_4_;
                fVar135 = auVar73._8_4_;
                fVar130 = auVar73._12_4_;
                fVar122 = (float)(-(uint)(1e-18 <= ABS(local_11b8)) &
                                 (uint)(((float)DAT_01feca10 - local_11b8 * fVar122) * fVar122 +
                                       fVar122));
                fVar147 = (float)(-(uint)(1e-18 <= ABS(fStack_11b4)) &
                                 (uint)((DAT_01feca10._4_4_ - fStack_11b4 * fVar147) * fVar147 +
                                       fVar147));
                fVar135 = (float)(-(uint)(1e-18 <= ABS(fStack_11b0)) &
                                 (uint)((DAT_01feca10._8_4_ - fStack_11b0 * fVar135) * fVar135 +
                                       fVar135));
                fVar130 = (float)(-(uint)(1e-18 <= ABS(fStack_11ac)) &
                                 (uint)((DAT_01feca10._12_4_ - fStack_11ac * fVar130) * fVar130 +
                                       fVar130));
                auVar113._0_4_ = fVar109 * fVar122;
                auVar113._4_4_ = fVar114 * fVar147;
                auVar113._8_4_ = local_fc8._8_4_ * fVar135;
                auVar113._12_4_ = local_fc8._12_4_ * fVar130;
                local_10c8 = minps(auVar113,_DAT_01feca10);
                auVar132._0_4_ = fVar122 * (float)local_1218._0_4_;
                auVar132._4_4_ = fVar147 * local_1218._4_4_;
                auVar132._8_4_ = fVar135 * local_1218._8_4_;
                auVar132._12_4_ = fVar130 * local_1218._12_4_;
                local_10b8 = minps(auVar132,_DAT_01feca10);
                auVar83._0_4_ = (uint)local_1238 & uVar47;
                auVar83._4_4_ = (uint)fStack_1234 & uVar48;
                auVar83._8_4_ = (uint)fStack_1230 & uVar52;
                auVar83._12_4_ = (uint)fStack_122c & uVar49;
                auVar78._0_8_ = CONCAT44(~uVar48,~uVar47) & 0x7f8000007f800000;
                auVar78._8_4_ = ~uVar52 & 0x7f800000;
                auVar78._12_4_ = ~uVar49 & 0x7f800000;
                auVar78 = auVar78 | auVar83;
                auVar84._4_4_ = auVar78._0_4_;
                auVar84._0_4_ = auVar78._4_4_;
                auVar84._8_4_ = auVar78._12_4_;
                auVar84._12_4_ = auVar78._8_4_;
                auVar73 = minps(auVar84,auVar78);
                auVar98._0_8_ = auVar73._8_8_;
                auVar98._8_4_ = auVar73._0_4_;
                auVar98._12_4_ = auVar73._4_4_;
                auVar73 = minps(auVar98,auVar73);
                auVar99._0_8_ =
                     CONCAT44(-(uint)(auVar73._4_4_ == auVar78._4_4_) & uVar48,
                              -(uint)(auVar73._0_4_ == auVar78._0_4_) & uVar47);
                auVar99._8_4_ = -(uint)(auVar73._8_4_ == auVar78._8_4_) & uVar52;
                auVar99._12_4_ = -(uint)(auVar73._12_4_ == auVar78._12_4_) & uVar49;
                iVar32 = movmskps(iVar32,auVar99);
                if (iVar32 != 0) {
                  auVar108._8_4_ = auVar99._8_4_;
                  auVar108._0_8_ = auVar99._0_8_;
                  auVar108._12_4_ = auVar99._12_4_;
                }
                lVar38 = lVar38 + uVar43;
                uVar33 = movmskps(iVar32,auVar108);
                pRVar37 = (RayHit *)0x0;
                if (CONCAT44(uVar31,uVar33) != 0) {
                  for (; (CONCAT44(uVar31,uVar33) >> (long)pRVar37 & 1) == 0;
                      pRVar37 = (RayHit *)((long)(pRVar37->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                _local_1208 = uVar45;
                do {
                  uVar47 = *(uint *)(lVar38 + 0x120 + (long)pRVar37 * 4);
                  pRVar36 = (RayHit *)(ulong)uVar47;
                  pGVar23 = (((Scene *)uVar45)->geometries).items[(long)pRVar36].ptr;
                  if ((pGVar23->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_11f8 + (long)pRVar37 * 4) = 0;
                  }
                  else {
                    pRVar24 = context->args;
                    if ((pRVar24->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar122 = *(float *)(local_10c8 + (long)pRVar37 * 4);
                      fVar147 = *(float *)(local_10b8 + (long)pRVar37 * 4);
                      (ray->super_RayK<1>).tfar = local_10a8[(long)pRVar37];
                      (ray->Ng).field_0.field_0.x = local_1098[(long)pRVar37];
                      (ray->Ng).field_0.field_0.y = local_1088[(long)pRVar37];
                      (ray->Ng).field_0.field_0.z = local_1078[(long)pRVar37];
                      ray->u = fVar122;
                      ray->v = fVar147;
                      ray->primID = *(uint *)(lVar38 + 0x130 + (long)pRVar37 * 4);
                      ray->geomID = uVar47;
                      pRVar25 = context->user;
                      ray->instID[0] = pRVar25->instID[0];
                      uVar47 = pRVar25->instPrimID[0];
                      uVar35 = (ulong)uVar47;
                      ray->instPrimID[0] = uVar47;
                      break;
                    }
                    local_11e8.context = context->user;
                    local_1168 = local_1098[(long)pRVar37];
                    local_1164 = local_1088[(long)pRVar37];
                    local_1160 = local_1078[(long)pRVar37];
                    local_115c = *(undefined4 *)(local_10c8 + (long)pRVar37 * 4);
                    local_1158 = *(undefined4 *)(local_10b8 + (long)pRVar37 * 4);
                    local_1154 = *(undefined4 *)(lVar38 + 0x130 + (long)pRVar37 * 4);
                    local_1150 = uVar47;
                    local_114c = (local_11e8.context)->instID[0];
                    local_1148 = (local_11e8.context)->instPrimID[0];
                    local_1218._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_10a8[(long)pRVar37];
                    local_121c = (undefined1  [4])0xffffffff;
                    local_11e8.valid = (int *)local_121c;
                    local_11e8.geometryUserPtr = pGVar23->userPtr;
                    local_11e8.ray = (RTCRayN *)ray;
                    local_11e8.hit = (RTCHitN *)&local_1168;
                    local_11e8.N = 1;
                    if ((pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       (local_11a8 = uVar41, (*pGVar23->intersectionFilterN)(&local_11e8),
                       context = local_1228, uVar39 = local_1240, uVar41 = local_11a8,
                       uVar42 = local_1248, *local_11e8.valid != 0)) {
                      if (pRVar24->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar24->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar23->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar24->filter)(&local_11e8);
                          context = local_1228;
                          uVar39 = local_1240;
                          uVar42 = local_1248;
                        }
                        if (*local_11e8.valid == 0) goto LAB_00defd8e;
                      }
                      (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11e8.hit;
                      (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11e8.hit + 4);
                      (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11e8.hit + 8);
                      *(float *)((long)local_11e8.ray + 0x3c) = *(float *)(local_11e8.hit + 0xc);
                      *(float *)((long)local_11e8.ray + 0x40) = *(float *)(local_11e8.hit + 0x10);
                      *(float *)((long)local_11e8.ray + 0x44) = *(float *)(local_11e8.hit + 0x14);
                      *(float *)((long)local_11e8.ray + 0x48) = *(float *)(local_11e8.hit + 0x18);
                      *(float *)((long)local_11e8.ray + 0x4c) = *(float *)(local_11e8.hit + 0x1c);
                      *(float *)((long)local_11e8.ray + 0x50) = *(float *)(local_11e8.hit + 0x20);
                      pRVar36 = (RayHit *)local_11e8.ray;
                    }
                    else {
LAB_00defd8e:
                      (ray->super_RayK<1>).tfar = (float)local_1218._0_4_;
                      pRVar36 = (RayHit *)local_11e8.valid;
                    }
                    *(undefined4 *)(local_11f8 + (long)pRVar37 * 4) = 0;
                    fVar122 = (ray->super_RayK<1>).tfar;
                    local_11f8._0_4_ = -(uint)(local_1238 <= fVar122) & local_11f8._0_4_;
                    local_11f8._4_4_ = -(uint)(fStack_1234 <= fVar122) & local_11f8._4_4_;
                    local_11f8._8_4_ = -(uint)(fStack_1230 <= fVar122) & local_11f8._8_4_;
                    local_11f8._12_4_ = -(uint)(fStack_122c <= fVar122) & local_11f8._12_4_;
                    uVar45 = _local_1208;
                  }
                  iVar32 = movmskps((int)pRVar36,local_11f8);
                  uVar35 = CONCAT44((int)((ulong)pRVar36 >> 0x20),iVar32);
                  if (iVar32 == 0) break;
                  BVHNIntersector1<4,16777232,true,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = local_1228;
                  pRVar37 = (RayHit *)local_11e8.valid;
                  uVar39 = local_1240;
                  uVar42 = local_1248;
                } while( true );
              }
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != local_1178);
        }
        fVar122 = (ray->super_RayK<1>).tfar;
        auVar73._4_4_ = fVar122;
        auVar73._0_4_ = fVar122;
        auVar73._8_4_ = fVar122;
        auVar73._12_4_ = fVar122;
        uVar35 = local_1180;
        uVar41 = local_1198;
        uVar44 = local_1190;
        uVar46 = local_1188;
        fVar122 = local_1008;
        fVar147 = fStack_1004;
        fVar135 = fStack_1000;
        fVar130 = fStack_ffc;
        fVar65 = local_1048;
        fVar59 = fStack_1044;
        fVar61 = fStack_1040;
        fVar62 = fStack_103c;
        fVar63 = local_1058;
        fVar64 = fStack_1054;
        fVar70 = fStack_1050;
        fVar71 = fStack_104c;
        fVar72 = local_1068;
        fVar91 = fStack_1064;
        fVar79 = fStack_1060;
        fVar80 = fStack_105c;
        fVar85 = local_1128;
        fVar86 = fStack_1124;
        fVar87 = fStack_1120;
        fVar88 = fStack_111c;
        fVar89 = local_1138;
        fVar90 = fStack_1134;
        fVar100 = fStack_1130;
        fVar101 = fStack_112c;
        fVar102 = local_1018;
        fVar109 = fStack_1014;
        fVar114 = fStack_1010;
        fVar115 = fStack_100c;
        fVar117 = local_1028;
        fVar118 = fStack_1024;
        fVar119 = fStack_1020;
        fVar120 = fStack_101c;
        fVar121 = local_1038;
        fVar123 = fStack_1034;
        fVar124 = fStack_1030;
        fVar125 = fStack_102c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }